

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpu_api_legacy.cpp
# Opt level: O0

int is_valid_dma_fd(int fd)

{
  int iVar1;
  int iVar2;
  int fd_flag;
  int fs_flag;
  int ret;
  int fd_local;
  
  fd_flag = 1;
  iVar1 = fcntl(fd,3,0);
  iVar2 = fcntl(fd,1,0);
  if ((iVar1 == -1) || (iVar2 == -1)) {
    fd_flag = 0;
  }
  return fd_flag;
}

Assistant:

static int is_valid_dma_fd(int fd)
{
    int ret = 1;
    /* detect input file handle */
    int fs_flag = fcntl(fd, F_GETFL, NULL);
    int fd_flag = fcntl(fd, F_GETFD, NULL);

    if (fs_flag == -1 || fd_flag == -1) {
        ret = 0;
    }

    return ret;
}